

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O2

int xsdTestSuite(xmlNodePtr cur)

{
  xmlXPathContextPtr_conflict pxVar1;
  FILE *pFVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar8;
  xmlNodePtr pxVar9;
  undefined8 uVar10;
  xmlNodePtr pxVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  int i;
  long lVar16;
  char *pcVar17;
  
  if ((verbose == '\x01') &&
     (pxVar7 = getString(cur,"string(documentation)"), pxVar7 != (xmlChar *)0x0)) {
    printf("Suite %s\n",pxVar7);
    (*_xmlFree)(pxVar7);
  }
  cur_00 = getNext(cur,"./testCase[1]");
  do {
    if (cur_00 == (xmlNodePtr)0x0) {
      return 0;
    }
    lVar15 = 0;
    for (lVar16 = 0; lVar16 < nb_entities; lVar16 = lVar16 + 1) {
      if (*(long *)((long)testEntitiesName + lVar15) != 0) {
        (*_xmlFree)();
      }
      if (*(long *)((long)testEntitiesValue + lVar15) != 0) {
        (*_xmlFree)();
      }
      lVar15 = lVar15 + 8;
    }
    nb_entities = 0;
    testErrorsSize = 0;
    testErrors[0] = '\0';
    pxVar8 = getNext(cur_00,"./dir[1]");
    if (pxVar8 != (xmlNodePtr)0x0) {
      installDirs(pxVar8,(xmlChar *)0x0);
    }
    pxVar8 = getNext(cur_00,"./resource[1]");
    if (pxVar8 != (xmlNodePtr)0x0) {
      installResources(pxVar8,(xmlChar *)0x0);
    }
    pxVar8 = getNext(cur_00,"./correct[1]");
    if (pxVar8 == (xmlNodePtr)0x0) {
      pxVar8 = getNext(cur_00,"./incorrect[1]");
      if (pxVar8 != (xmlNodePtr)0x0) {
        pxVar9 = getNext(pxVar8,"./*");
        if (pxVar9 == (xmlNodePtr)0x0) {
          uVar10 = xmlGetLineNo(pxVar8);
          test_log("Failed to find test in correct line %ld\n",uVar10);
        }
        else {
          iVar3 = xmlMemUsed();
          lVar15 = xmlBufferCreate();
          if (lVar15 == 0) goto LAB_00103ef4;
          xmlBufferSetAllocationScheme(lVar15,0);
          xmlNodeDump(lVar15,pxVar9->doc,pxVar9,0,0);
          uVar10 = xmlBufferContent(lVar15);
          uVar4 = xmlBufferLength(lVar15);
          uVar10 = xmlRelaxNGNewMemParserCtxt(uVar10,uVar4);
          xmlRelaxNGSetParserErrors(uVar10,testErrorHandler);
          xmlRelaxNGSetResourceLoader(uVar10,testResourceLoader,0);
          lVar16 = xmlRelaxNGParse(uVar10);
          xmlRelaxNGFreeParserCtxt(uVar10);
          if (lVar16 == 0) {
            xmlBufferFree(lVar15);
          }
          else {
            uVar10 = xmlGetLineNo(pxVar9);
            test_log("Failed to detect incorrect RNG line %ld\n",uVar10);
            xmlBufferFree(lVar15);
            xmlRelaxNGFree(lVar16);
          }
          xmlResetLastError();
          iVar5 = xmlMemUsed();
          if (iVar3 != iVar5) goto LAB_00103e18;
        }
      }
    }
    else {
      pxVar9 = getNext(pxVar8,"./*");
      pFVar2 = _stderr;
      if (pxVar9 == (xmlNodePtr)0x0) {
        uVar10 = xmlGetLineNo(pxVar8);
        fprintf(pFVar2,"Failed to find test in correct line %ld\n",uVar10);
      }
      else {
        iVar3 = xmlMemUsed();
        lVar15 = xmlBufferCreate();
        if (lVar15 == 0) {
LAB_00103ef4:
          pcVar17 = "out of memory !\n";
          lVar15 = 0x10;
          fwrite("out of memory !\n",0x10,1,_stderr);
          fatalError();
          pxVar1 = ctxtXPath;
          if (lVar15 != 0 && ((xmlNodePtr)pcVar17)->doc != (xmlDocPtr)0x0) {
            ctxtXPath->doc = ((xmlNodePtr)pcVar17)->doc;
            pxVar1->node = (xmlNodePtr)pcVar17;
            lVar16 = xmlXPathCompile(lVar15);
            if (lVar16 == 0) {
              fprintf(_stderr,"Failed to compile %s\n",lVar15);
              return 0;
            }
            piVar14 = (int *)xmlXPathCompiledEval(lVar16,ctxtXPath);
            xmlXPathFreeCompExpr(lVar16);
            if (piVar14 != (int *)0x0) {
              if (*piVar14 == 4) {
                iVar3 = (int)*(undefined8 *)(piVar14 + 8);
                piVar14[8] = 0;
                piVar14[9] = 0;
              }
              else {
                iVar3 = 0;
              }
              xmlXPathFreeObject(piVar14);
              return iVar3;
            }
          }
          return 0;
        }
        xmlBufferSetAllocationScheme(lVar15,0);
        xmlNodeDump(lVar15,pxVar9->doc,pxVar9,0,0);
        uVar10 = xmlBufferContent(lVar15);
        uVar4 = xmlBufferLength(lVar15);
        uVar10 = xmlRelaxNGNewMemParserCtxt(uVar10,uVar4);
        xmlRelaxNGSetParserErrors(uVar10,testErrorHandler,testErrorHandler,uVar10);
        xmlRelaxNGSetResourceLoader(uVar10,testResourceLoader,0);
        lVar16 = xmlRelaxNGParse(uVar10);
        xmlRelaxNGFreeParserCtxt(uVar10);
        pxVar11 = pxVar8;
        if (lVar16 == 0) {
          uVar10 = xmlGetLineNo(pxVar9);
          test_log("Failed to parse RNGtest line %ld\n",uVar10);
          nb_errors = nb_errors + 1;
        }
        else {
          while (pxVar11 = getNext(pxVar11,"following-sibling::valid[1]"), pxVar9 = pxVar8,
                pxVar11 != (xmlNodePtr)0x0) {
            lVar12 = xmlGetProp(pxVar11,"dtd");
            pxVar9 = getNext(pxVar11,"./*");
            pFVar2 = _stderr;
            if (pxVar9 == (xmlNodePtr)0x0) {
              uVar10 = xmlGetLineNo(pxVar11);
              fprintf(pFVar2,"Failed to find test in <valid> line %ld\n",uVar10);
            }
            else {
              xmlBufferEmpty(lVar15);
              if (lVar12 != 0) {
                xmlBufferAdd(lVar15,lVar12,0xffffffffffffffff);
              }
              xmlNodeDump(lVar15,pxVar9->doc,pxVar9,0,0);
              iVar5 = xmlMemUsed();
              uVar10 = xmlBufferContent(lVar15);
              uVar4 = xmlBufferLength(lVar15);
              lVar13 = xmlReadMemory(uVar10,uVar4,"test",0);
              if (lVar13 == 0) {
                uVar10 = xmlGetLineNo(pxVar11);
                test_log("Failed to parse valid instance line %ld\n",uVar10);
                nb_errors = nb_errors + 1;
              }
              else {
                nb_tests = nb_tests + 1;
                uVar10 = xmlRelaxNGNewValidCtxt(lVar16);
                xmlRelaxNGSetValidErrors(uVar10,testErrorHandler,testErrorHandler,uVar10);
                iVar6 = xmlRelaxNGValidateDoc(uVar10,lVar13);
                xmlRelaxNGFreeValidCtxt(uVar10);
                pcVar17 = "Failed to validate valid instance line %ld\n";
                if ((0 < iVar6) ||
                   (pcVar17 = "Internal error validating instance line %ld\n", iVar6 < 0)) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  test_log(pcVar17,uVar10);
                  nb_errors = nb_errors + 1;
                }
                xmlFreeDoc(lVar13);
              }
              xmlResetLastError();
              iVar6 = xmlMemUsed();
              if (iVar5 != iVar6) {
                uVar10 = xmlGetLineNo(pxVar11);
                iVar6 = xmlMemUsed();
                test_log("Validation of instance line %ld leaked %d\n",uVar10,
                         (ulong)(uint)(iVar6 - iVar5));
                nb_leaks = nb_leaks + 1;
              }
            }
            if (lVar12 != 0) {
              (*_xmlFree)(lVar12);
            }
          }
          while (pxVar9 = getNext(pxVar9,"following-sibling::invalid[1]"), pxVar9 != (xmlNodePtr)0x0
                ) {
            pxVar11 = getNext(pxVar9,"./*");
            pFVar2 = _stderr;
            if (pxVar11 == (xmlNodePtr)0x0) {
              uVar10 = xmlGetLineNo(pxVar9);
              fprintf(pFVar2,"Failed to find test in <invalid> line %ld\n",uVar10);
            }
            else {
              xmlBufferEmpty(lVar15);
              xmlNodeDump(lVar15,pxVar11->doc,pxVar11,0,0);
              iVar5 = xmlMemUsed();
              uVar10 = xmlBufferContent(lVar15);
              uVar4 = xmlBufferLength(lVar15);
              lVar12 = xmlReadMemory(uVar10,uVar4,"test");
              if (lVar12 == 0) {
                uVar10 = xmlGetLineNo(pxVar9);
                test_log("Failed to parse valid instance line %ld\n",uVar10);
                nb_errors = nb_errors + 1;
              }
              else {
                nb_tests = nb_tests + 1;
                uVar10 = xmlRelaxNGNewValidCtxt(lVar16);
                xmlRelaxNGSetValidErrors(uVar10,testErrorHandler);
                iVar6 = xmlRelaxNGValidateDoc(uVar10,lVar12);
                xmlRelaxNGFreeValidCtxt(uVar10);
                pcVar17 = "Failed to detect invalid instance line %ld\n";
                if ((iVar6 == 0) ||
                   (pcVar17 = "Internal error validating instance line %ld\n", iVar6 < 0)) {
                  uVar10 = xmlGetLineNo(pxVar9);
                  test_log(pcVar17,uVar10);
                  nb_errors = nb_errors + 1;
                }
                xmlFreeDoc(lVar12);
              }
              xmlResetLastError();
              iVar6 = xmlMemUsed();
              if (iVar5 != iVar6) {
                uVar10 = xmlGetLineNo(pxVar9);
                iVar6 = xmlMemUsed();
                test_log("Validation of instance line %ld leaked %d\n",uVar10,
                         (ulong)(uint)(iVar6 - iVar5));
                nb_leaks = nb_leaks + 1;
              }
            }
          }
        }
        xmlBufferFree(lVar15);
        if (lVar16 != 0) {
          xmlRelaxNGFree();
        }
        xmlResetLastError();
        iVar5 = xmlMemUsed();
        if (iVar3 != 0 && iVar3 != iVar5) {
LAB_00103e18:
          uVar10 = xmlGetLineNo(pxVar8);
          iVar5 = xmlMemUsed();
          test_log("Validation of tests starting line %ld leaked %d\n",uVar10,
                   (ulong)(uint)(iVar5 - iVar3));
          nb_leaks = nb_leaks + 1;
        }
      }
    }
    cur_00 = getNext(cur_00,"following-sibling::testCase[1]");
  } while( true );
}

Assistant:

static int
xsdTestSuite(xmlNodePtr cur) {
    if (verbose) {
	xmlChar *doc = getString(cur, "string(documentation)");

	if (doc != NULL) {
	    printf("Suite %s\n", doc);
	    xmlFree(doc);
	}
    }
    cur = getNext(cur, "./testCase[1]");
    while (cur != NULL) {
        xsdTestCase(cur);
	cur = getNext(cur, "following-sibling::testCase[1]");
    }

    return(0);
}